

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O1

float Imath_3_2::predf(float f)

{
  float fVar1;
  
  if (0x7f7fffff < (uint)ABS(f)) {
    return f;
  }
  fVar1 = nextafterf(f,-INFINITY);
  return fVar1;
}

Assistant:

float predf(float f) IMATH_NOEXCEPT
{
    return std::isfinite(f) ?
            std::nextafter(f, -std::numeric_limits<float>::infinity()) : f;
}